

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<int,int,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,function<int_(int,_int)> *f)

{
  function<int_(int,_int)> *method;
  function<int_(int,_int)> local_30;
  
  std::function<int_(int,_int)>::function(&local_30,(function<int_(int,_int)> *)this);
  methodHandle<int,int,int>(__return_storage_ptr__,(jsonrpccxx *)&local_30,method);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }